

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_flow_sl(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this,size_t node,size_t ilevel)

{
  Tree *pTVar1;
  NodeType_e NVar2;
  pfn_error p_Var3;
  code *pcVar4;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location LVar5;
  bool bVar6;
  error_flags eVar7;
  NodeData *pNVar8;
  csubstr *pcVar9;
  size_t i;
  NodeScalar *pNVar10;
  char cVar11;
  uint uVar12;
  int __fd;
  long lVar13;
  csubstr cVar14;
  char msg [37];
  undefined3 uStack_73;
  char *pcStack_40;
  size_t local_38;
  
  pNVar8 = Tree::_p(this->m_tree,node);
  if ((~(int)(pNVar8->m_type).type & 0x28U) == 0) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    join_0x00000010_0x00000000_ =
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = -0x39;
    msg[9] = 'X';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x58c7) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x58c7) << 0x40,8);
    loc.name.str = (char *)msg._24_8_;
    loc.name.len = msg._32_8_;
    error("check failed: !m_tree->is_stream(node)",0x26,loc);
  }
  pNVar8 = Tree::_p(this->m_tree,node);
  if ((((pNVar8->m_type).type & (STREAM|MAP)) == NOTYPE) &&
     (pNVar8 = Tree::_p(this->m_tree,node), ((pNVar8->m_type).type & DOC) == NOTYPE)) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    join_0x00000010_0x00000000_ =
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = -0x38;
    msg[9] = 'X';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x58c8) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x58c8) << 0x40,8);
    loc_00.name.str = (char *)msg._24_8_;
    loc_00.name.len = msg._32_8_;
    error("check failed: m_tree->is_container(node) || m_tree->is_doc(node)",0x40,loc_00);
  }
  bVar6 = Tree::is_root(this->m_tree,node);
  if (!bVar6) {
    pTVar1 = this->m_tree;
    bVar6 = Tree::has_parent(pTVar1,node);
    if (!bVar6) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      join_0x00000010_0x00000000_ =
           to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x15;
      msg[9] = 'K';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      loc_01.super_LineCol.col = 0;
      loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4beb) << 0x40,0);
      loc_01.super_LineCol.line = SUB168(ZEXT816(0x4beb) << 0x40,8);
      loc_01.name.str = (char *)msg._24_8_;
      loc_01.name.len = msg._32_8_;
      error("check failed: has_parent(node)",0x1e,loc_01);
    }
    pNVar8 = Tree::_p(pTVar1,node);
    pNVar8 = Tree::_p(pTVar1,pNVar8->m_parent);
    if (((pNVar8->m_type).type & MAP) == NOTYPE) {
      pTVar1 = this->m_tree;
      bVar6 = Tree::has_parent(pTVar1,node);
      if (!bVar6) {
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        join_0x00000010_0x00000000_ =
             to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x16;
        msg[9] = 'K';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        loc_02.super_LineCol.col = 0;
        loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4bea) << 0x40,0);
        loc_02.super_LineCol.line = SUB168(ZEXT816(0x4bea) << 0x40,8);
        loc_02.name.str = (char *)msg._24_8_;
        loc_02.name.len = msg._32_8_;
        error("check failed: has_parent(node)",0x1e,loc_02);
      }
      pNVar8 = Tree::_p(pTVar1,node);
      pNVar8 = Tree::_p(pTVar1,pNVar8->m_parent);
      if (((pNVar8->m_type).type & SEQ) == NOTYPE) {
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        join_0x00000010_0x00000000_ =
             to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x37;
        msg[9] = 'X';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        loc_03.super_LineCol.col = 0;
        loc_03.super_LineCol.offset = SUB168(ZEXT816(0x58c9) << 0x40,0);
        loc_03.super_LineCol.line = SUB168(ZEXT816(0x58c9) << 0x40,8);
        loc_03.name.str = (char *)msg._24_8_;
        loc_03.name.len = msg._32_8_;
        error("check failed: m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node))"
              ,99,loc_03);
      }
    }
  }
  pNVar8 = Tree::_p(this->m_tree,node);
  if (((pNVar8->m_type).type & DOC) != NOTYPE) {
    _write_doc(this,node);
    bVar6 = Tree::has_children(this->m_tree,node);
    if (!bVar6) {
      return;
    }
    goto LAB_001b71f9;
  }
  pNVar8 = Tree::_p(this->m_tree,node);
  if (((pNVar8->m_type).type & (STREAM|MAP)) == NOTYPE) goto LAB_001b71f9;
  pNVar8 = Tree::_p(this->m_tree,node);
  if ((((pNVar8->m_type).type & MAP) == NOTYPE) &&
     (pNVar8 = Tree::_p(this->m_tree,node), ((pNVar8->m_type).type & SEQ) == NOTYPE)) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    join_0x00000010_0x00000000_ =
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = -0x2d;
    msg[9] = 'X';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    loc_04.super_LineCol.col = 0;
    loc_04.super_LineCol.offset = SUB168(ZEXT816(0x58d3) << 0x40,0);
    loc_04.super_LineCol.line = SUB168(ZEXT816(0x58d3) << 0x40,8);
    loc_04.name.str = (char *)msg._24_8_;
    loc_04.name.len = msg._32_8_;
    error("check failed: m_tree->is_map(node) || m_tree->is_seq(node)",0x3a,loc_04);
  }
  pNVar8 = Tree::_p(this->m_tree,node);
  bVar6 = ((pNVar8->m_type).type & KEY) != NOTYPE;
  if (bVar6) {
    pNVar10 = Tree::keysc(this->m_tree,node);
    pNVar8 = Tree::_p(this->m_tree,node);
    _write(this,(int)pNVar10,(void *)(ulong)((uint)(pNVar8->m_type).type & 0x2aa2142),ilevel);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,':');
  }
  pNVar8 = Tree::_p(this->m_tree,node);
  NVar2 = (pNVar8->m_type).type;
  if ((NVar2 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar2 >> 0xb & 1) != 0) {
    if (bVar6) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
    }
    pcVar9 = Tree::val_tag(this->m_tree,node);
    _write_tag(this,*pcVar9);
    bVar6 = true;
  }
  pNVar8 = Tree::_p(this->m_tree,node);
  NVar2 = (pNVar8->m_type).type;
  if ((NVar2 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar2 >> 9 & 1) == 0) {
    if (bVar6) goto LAB_001b7109;
  }
  else {
    if (bVar6) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
    }
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'&');
    pcVar9 = Tree::val_anchor(this->m_tree,node);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,*pcVar9);
LAB_001b7109:
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,' ');
  }
  pNVar8 = Tree::_p(this->m_tree,node);
  if (((pNVar8->m_type).type & MAP) == NOTYPE) {
    pNVar8 = Tree::_p(this->m_tree,node);
    if (((pNVar8->m_type).type & SEQ) == NOTYPE) {
      builtin_strncpy(msg + 0x10,"_tree->i",8);
      builtin_strncpy(msg,"check failed: (m",0x10);
      builtin_strncpy(msg + 0x18,"s_seq(node))",0xd);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      p_Var3 = (this->m_tree->m_callbacks).m_error;
      cVar14 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_38 = cVar14.len;
      pcStack_40 = cVar14.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x58f8) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x58f8) << 0x40,8);
      LVar5.name.str = pcStack_40;
      LVar5.name.len = local_38;
      (*p_Var3)(msg,0x25,LVar5,(this->m_tree->m_callbacks).m_user_data);
    }
    cVar11 = '[';
  }
  else {
    cVar11 = '{';
  }
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write(&this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,cVar11);
LAB_001b71f9:
  i = Tree::first_child(this->m_tree,node);
  lVar13 = 0;
  do {
    if (i == 0xffffffffffffffff) {
      pNVar8 = Tree::_p(this->m_tree,node);
      cVar11 = '}';
      if (((pNVar8->m_type).type & MAP) == NOTYPE) {
        pNVar8 = Tree::_p(this->m_tree,node);
        cVar11 = ']';
        if (((pNVar8->m_type).type & SEQ) == NOTYPE) {
          return;
        }
      }
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,cVar11);
      return;
    }
    bVar6 = lVar13 != 0;
    lVar13 = lVar13 + -1;
    if (bVar6) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,',');
    }
    pNVar8 = Tree::_p(this->m_tree,i);
    if ((~(int)(pNVar8->m_type).type & 3U) == 0) {
      pNVar10 = Tree::keysc(this->m_tree,i);
      pNVar8 = Tree::_p(this->m_tree,i);
      _write(this,(int)pNVar10,(void *)(ulong)((uint)(pNVar8->m_type).type & 0x2aa2142),ilevel);
      WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
                ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])0x20b38f);
      pNVar10 = Tree::valsc(this->m_tree,i);
      pNVar8 = Tree::_p(this->m_tree,i);
      uVar12 = (uint)(pNVar8->m_type).type;
      __fd = (int)pNVar10;
LAB_001b72fb:
      _write(this,__fd,(void *)(ulong)(uVar12 & 0x5541281),ilevel);
    }
    else {
      pNVar8 = Tree::_p(this->m_tree,i);
      if (((pNVar8->m_type).type & KEYVAL) == VAL) {
        pNVar10 = Tree::valsc(this->m_tree,i);
        pNVar8 = Tree::_p(this->m_tree,i);
        uVar12 = (uint)(pNVar8->m_type).type;
        __fd = (int)pNVar10;
        goto LAB_001b72fb;
      }
      _do_visit_flow_sl(this,i,ilevel + 1);
    }
    i = Tree::next_sibling(this->m_tree,i);
  } while( true );
}

Assistant:

void Emitter<Writer>::_do_visit_flow_sl(size_t node, size_t ilevel)
{
    RYML_ASSERT(!m_tree->is_stream(node));
    RYML_ASSERT(m_tree->is_container(node) || m_tree->is_doc(node));
    RYML_ASSERT(m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node)));

    if(m_tree->is_doc(node))
    {
        _write_doc(node);
        if(!m_tree->has_children(node))
            return;
    }
    else if(m_tree->is_container(node))
    {
        RYML_ASSERT(m_tree->is_map(node) || m_tree->is_seq(node));

        bool spc = false; // write a space

        if(m_tree->has_key(node))
        {
            _writek(node, ilevel);
            this->Writer::_do_write(':');
            spc = true;
        }

        if(m_tree->has_val_tag(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(node));
            spc = true;
        }

        if(m_tree->has_val_anchor(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(node));
            spc = true;
        }

        if(spc)
            this->Writer::_do_write(' ');

        if(m_tree->is_map(node))
        {
            this->Writer::_do_write('{');
        }
        else
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_seq(node));
            this->Writer::_do_write('[');
        }
    } // container

    for(size_t child = m_tree->first_child(node), count = 0; child != NONE; child = m_tree->next_sibling(child))
    {
        if(count++)
            this->Writer::_do_write(',');
        if(m_tree->is_keyval(child))
        {
            _writek(child, ilevel);
            this->Writer::_do_write(": ");
            _writev(child, ilevel);
        }
        else if(m_tree->is_val(child))
        {
            _writev(child, ilevel);
        }
        else
        {
            // with single-line flow, we can never go back to block
            _do_visit_flow_sl(child, ilevel + 1);
        }
    }

    if(m_tree->is_map(node))
    {
        this->Writer::_do_write('}');
    }
    else if(m_tree->is_seq(node))
    {
        this->Writer::_do_write(']');
    }
}